

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O2

Edge * __thiscall
S2LaxPolygonShape::edge(Edge *__return_storage_ptr__,S2LaxPolygonShape *this,int e0)

{
  int iVar1;
  Vector3<double> *pVVar2;
  VType VVar3;
  anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 aVar4;
  LogSeverity LVar5;
  long lVar6;
  anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *paVar7;
  S2LogMessage local_30;
  
  iVar1 = *(int *)&(this->super_S2Shape).field_0xc;
  lVar6 = (long)iVar1;
  aVar4 = this->field_2;
  paVar7 = (anon_union_8_2_29389cd6_for_S2LaxPolygonShape_4 *)(aVar4.cumulative_vertices_ + lVar6);
  if (lVar6 < 2) {
    paVar7 = &this->field_2;
  }
  if (paVar7->num_vertices_ <= e0) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Check failed: (e0) < (num_edges()) ");
    abort();
  }
  local_30.severity_ = e0 + kWarning;
  if (iVar1 == 1) {
    if (local_30.severity_ == aVar4.num_vertices_) {
      local_30.severity_ = kInfo;
    }
  }
  else {
    if (iVar1 < 0xd) {
      do {
        LVar5 = aVar4.cumulative_vertices_[1];
        aVar4.cumulative_vertices_ = aVar4.cumulative_vertices_ + 1;
      } while (LVar5 <= (uint)e0);
    }
    else {
      aVar4.cumulative_vertices_ =
           std::__lower_bound<unsigned_int*,int,__gnu_cxx::__ops::_Iter_less_val>
                     (aVar4.cumulative_vertices_ + 1,aVar4.cumulative_vertices_ + 1 + lVar6,
                      &local_30);
      LVar5 = *aVar4.cumulative_vertices_;
    }
    if (local_30.severity_ == LVar5) {
      local_30.severity_ = aVar4.cumulative_vertices_[-1];
    }
  }
  pVVar2 = (this->vertices_)._M_t.
           super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
           super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
           super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
  (__return_storage_ptr__->v0).c_[2] = pVVar2[e0].c_[2];
  VVar3 = pVVar2[e0].c_[1];
  (__return_storage_ptr__->v0).c_[0] = pVVar2[e0].c_[0];
  (__return_storage_ptr__->v0).c_[1] = VVar3;
  VVar3 = pVVar2[(int)local_30.severity_].c_[1];
  (__return_storage_ptr__->v1).c_[0] = pVVar2[(int)local_30.severity_].c_[0];
  (__return_storage_ptr__->v1).c_[1] = VVar3;
  (__return_storage_ptr__->v1).c_[2] = pVVar2[(int)local_30.severity_].c_[2];
  return __return_storage_ptr__;
}

Assistant:

S2Shape::Edge S2LaxPolygonShape::edge(int e0) const {
  S2_DCHECK_LT(e0, num_edges());
  int e1 = e0 + 1;
  if (num_loops() == 1) {
    if (e1 == num_vertices_) { e1 = 0; }
  } else {
    // Find the index of the first vertex of the loop following this one.
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    uint32* next = cumulative_vertices_ + 1;
    if (num_loops() <= kMaxLinearSearchLoops) {
      while (*next <= e0) ++next;
    } else {
      next = std::lower_bound(next, next + num_loops(), e1);
    }
    // Wrap around to the first vertex of the loop if necessary.
    if (e1 == *next) { e1 = next[-1]; }
  }
  return Edge(vertices_[e0], vertices_[e1]);
}